

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_BlendMode *
GPU_GetBlendModeFromPreset(GPU_BlendMode *__return_storage_ptr__,GPU_BlendPresetEnum preset)

{
  GPU_BlendMode *b;
  GPU_BlendPresetEnum preset_local;
  
  switch(preset) {
  case GPU_BLEND_NORMAL:
    __return_storage_ptr__->source_color = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->source_alpha = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  case GPU_BLEND_PREMULTIPLIED_ALPHA:
    __return_storage_ptr__->source_color = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->source_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  case GPU_BLEND_MULTIPLY:
    __return_storage_ptr__->source_color = GPU_FUNC_DST_COLOR;
    __return_storage_ptr__->dest_color = GPU_FUNC_ZERO;
    __return_storage_ptr__->source_alpha = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  case GPU_BLEND_ADD:
    __return_storage_ptr__->source_color = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE;
    __return_storage_ptr__->source_alpha = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  case GPU_BLEND_SUBTRACT:
    __return_storage_ptr__->source_color = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE;
    __return_storage_ptr__->source_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->color_equation = GPU_EQ_SUBTRACT;
    __return_storage_ptr__->alpha_equation = GPU_EQ_SUBTRACT;
    break;
  case GPU_BLEND_MOD_ALPHA:
    __return_storage_ptr__->source_color = GPU_FUNC_ZERO;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE;
    __return_storage_ptr__->source_alpha = GPU_FUNC_ZERO;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  case GPU_BLEND_SET_ALPHA:
    __return_storage_ptr__->source_color = GPU_FUNC_ZERO;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE;
    __return_storage_ptr__->source_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ZERO;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  case GPU_BLEND_SET:
    __return_storage_ptr__->source_color = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_color = GPU_FUNC_ZERO;
    __return_storage_ptr__->source_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ZERO;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  case GPU_BLEND_NORMAL_KEEP_ALPHA:
    __return_storage_ptr__->source_color = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->source_alpha = GPU_FUNC_ZERO;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  case GPU_BLEND_NORMAL_ADD_ALPHA:
    __return_storage_ptr__->source_color = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->source_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  case GPU_BLEND_NORMAL_FACTOR_ALPHA:
    __return_storage_ptr__->source_color = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->source_alpha = GPU_FUNC_ONE_MINUS_DST_ALPHA;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    break;
  default:
    GPU_PushErrorCode("GPU_GetBlendModeFromPreset",GPU_ERROR_USER_ERROR,
                      "Blend preset not supported: %d",(ulong)preset);
    __return_storage_ptr__->source_color = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->source_alpha = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
  }
  return __return_storage_ptr__;
}

Assistant:

GPU_BlendMode GPU_GetBlendModeFromPreset(GPU_BlendPresetEnum preset)
{
    switch(preset)
    {
    case GPU_BLEND_NORMAL:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_PREMULTIPLIED_ALPHA:
    {
        GPU_BlendMode b = {GPU_FUNC_ONE, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_ONE, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_MULTIPLY:
    {
        GPU_BlendMode b = {GPU_FUNC_DST_COLOR, GPU_FUNC_ZERO, GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_ADD:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE, GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_SUBTRACT:
        // FIXME: Use src alpha for source components?
    {
        GPU_BlendMode b = {GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_EQ_SUBTRACT, GPU_EQ_SUBTRACT};
        return b;
    }
    break;
    case GPU_BLEND_MOD_ALPHA:
        // Don't disturb the colors, but multiply the dest alpha by the src alpha
    {
        GPU_BlendMode b = {GPU_FUNC_ZERO, GPU_FUNC_ONE, GPU_FUNC_ZERO, GPU_FUNC_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_SET_ALPHA:
        // Don't disturb the colors, but set the alpha to the src alpha
    {
        GPU_BlendMode b = {GPU_FUNC_ZERO, GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_FUNC_ZERO, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_SET:
    {
        GPU_BlendMode b = {GPU_FUNC_ONE, GPU_FUNC_ZERO, GPU_FUNC_ONE, GPU_FUNC_ZERO, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_NORMAL_KEEP_ALPHA:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_ZERO, GPU_FUNC_ONE, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_NORMAL_ADD_ALPHA:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_NORMAL_FACTOR_ALPHA:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_ONE_MINUS_DST_ALPHA, GPU_FUNC_ONE, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    default:
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Blend preset not supported: %d", preset);
        {
            GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
            return b;
        }
        break;
    }
}